

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-tval.c
# Opt level: O1

wchar_t tval_sval_count(char *name)

{
  wchar_t wVar1;
  wchar_t wVar2;
  long lVar3;
  
  wVar1 = tval_find_idx(name);
  wVar2 = L'\0';
  if ((L'\xffffffff' < wVar1) && (wVar2 = L'\0', (ulong)z_info->k_max != 0)) {
    lVar3 = 0;
    wVar2 = L'\0';
    do {
      wVar2 = wVar2 + (uint)(*(wchar_t *)(k_info->flags + lVar3 + -0x5c) == wVar1 &&
                            *(wchar_t *)(k_info->flags + lVar3 + -0x5c) != L'\0');
      lVar3 = lVar3 + 0x2c0;
    } while ((ulong)z_info->k_max * 0x2c0 - lVar3 != 0);
  }
  return wVar2;
}

Assistant:

int tval_sval_count(const char *name)
{
	size_t i, num = 0;
	int tval = tval_find_idx(name);

	if (tval < 0) return 0;

	for (i = 0; i < z_info->k_max; i++) {
		struct object_kind *kind = &k_info[i];

		if (!kind->tval) continue;
		if (kind->tval != tval) continue;
		num++;
	}

	return num;
}